

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DELVING(effect_handler_context_t_conflict *context)

{
  loc_conflict finish;
  _Bool _Var1;
  source sVar2;
  source origin;
  loc lStack_18;
  wchar_t flg;
  loc_conflict grid;
  effect_handler_context_t_conflict *context_local;
  
  grid = (loc_conflict)context;
  lStack_18 = loc(0,0);
  target_get(&stack0xffffffffffffffe8);
  *(undefined1 *)((long)grid + 0x60) = 1;
  _Var1 = loc_eq(lStack_18,player->grid);
  if (_Var1) {
    sVar2._4_4_ = 0;
    sVar2.what = *(uint *)((long)grid + 8);
    finish.x = (player->grid).x;
    finish.y = (player->grid).y;
    sVar2.which.trap = ((anon_union_8_5_62f3dbed_for_which_conflict1 *)((long)grid + 0x10))->trap;
    project(sVar2,L'\x04',finish,L'Ĭ',L'\x1e',L't',L'\0','\x02',(object *)0x0);
  }
  else {
    sVar2 = source_player();
    origin.which = sVar2.which;
    origin._4_4_ = 0;
    origin.what = sVar2.what;
    effect_simple(L'\\',origin,"160 + d240",L'\x1e',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  }
  return true;
}

Assistant:

bool effect_handler_DELVING(effect_handler_context_t *context)
{
	struct loc grid = loc(0, 0);
	int flg = PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL | PROJECT_THRU;
	target_get(&grid);

	context->ident = true;

	/* Aimed at oneself, this rod creates a room. */
	if (loc_eq(grid, player->grid)) {
		/* Lots of damage to creatures of stone. */
		(void) project(context->origin, 4, player->grid, 300, PROJ_KILL_WALL,
					   flg, 0, 2, NULL);
	} else {
		/* Otherwise, an extremely powerful destroy wall/stone. */
		effect_simple(EF_LINE, source_player(), "160 + d240", PROJ_KILL_WALL, 0,
					  0, 0, 0, NULL);
	}
	return true;
}